

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int buffer_reserve(BUFFER *buf,size_t n)

{
  size_t alloc_00;
  BUFFER *in_RSI;
  long in_RDI;
  size_t alloc;
  int local_4;
  
  if ((ulong)((long)&in_RSI->data + *(long *)(in_RDI + 8)) < *(ulong *)(in_RDI + 0x10)) {
    local_4 = 0;
  }
  else {
    alloc_00 = buffer_good_alloc_size((long)&in_RSI->data + *(long *)(in_RDI + 8));
    local_4 = buffer_realloc(in_RSI,alloc_00);
  }
  return local_4;
}

Assistant:

int
buffer_reserve(BUFFER* buf, size_t n)
{
    size_t alloc;

    if(buf->size + n < buf->alloc)
        return 0;

    alloc = buf->size + n;
    alloc = buffer_good_alloc_size(alloc);

    return buffer_realloc(buf, alloc);
}